

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManPropagateEla(Jf_Man_t *p,int fEdge)

{
  word *pwVar1;
  uint uVar2;
  Jf_Par_t *pJVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  int *piVar6;
  int fReverse;
  int iVar7;
  int iVar8;
  
  pJVar3 = p->pPars;
  pJVar3->Area = 0;
  pJVar3->Edge = 0;
  pJVar3->Clause = 0;
  iVar7 = p->pGia->nObjs;
  while (0 < iVar7) {
    iVar7 = iVar7 + -1;
    pObj = Gia_ManObj(p->pGia,iVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjIsBuf(pObj);
    if (iVar4 != 0) {
      Jf_ObjPropagateBuf(p,pObj,fReverse);
      goto LAB_0058e7f6;
    }
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar4 = Gia_ObjRefNum(p->pGia,pObj);
      if (0 < iVar4) {
        if ((pObj->field_0x3 & 0x40) != 0) {
LAB_0058e7f6:
          __assert_fail("Jf_ObjIsUnit(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                        ,0x578,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
        }
        piVar6 = Jf_ObjCuts(p,iVar7);
        p->vTemp->nSize = 0;
        iVar4 = Jf_CutCheckMffc_rec(p,piVar6 + 1,0x32);
        iVar8 = 0;
        while( true ) {
          if (p->vTemp->nSize <= iVar8) break;
          iVar5 = Vec_IntEntry(p->vTemp,iVar8);
          piVar6 = p->pGia->pRefs + iVar5;
          *piVar6 = *piVar6 + 1;
          iVar8 = iVar8 + 1;
        }
        if (iVar4 != 0) {
          piVar6 = Jf_ObjCuts(p,iVar7);
          iVar4 = Jf_CutDeref_rec(p,piVar6 + 1);
          Jf_ObjComputeBestCut(p,pObj,fEdge,1);
          piVar6 = Jf_ObjCuts(p,iVar7);
          iVar8 = Jf_CutRef_rec(p,piVar6 + 1);
          if (iVar4 < iVar8) {
            __assert_fail("CostBef >= CostAft",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                          ,0x57f,"void Jf_ManPropagateEla(Jf_Man_t *, int)");
          }
        }
        if (p->pPars->fGenCnf != 0) {
          piVar6 = Jf_ObjCuts(p,iVar7);
          iVar4 = Jf_CutCnfSize(p,piVar6 + 1);
          pwVar1 = &p->pPars->Clause;
          *pwVar1 = *pwVar1 + (long)iVar4;
        }
        piVar6 = Jf_ObjCuts(p,iVar7);
        uVar2 = piVar6[1];
        pJVar3 = p->pPars;
        pJVar3->Area = pJVar3->Area + 1;
        pJVar3->Edge = (ulong)(uVar2 & 0xf) + pJVar3->Edge;
      }
    }
  }
  iVar7 = Jf_ManComputeDelay(p,1);
  p->pPars->Delay = (long)iVar7;
  return;
}

Assistant:

void Jf_ManPropagateEla( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; 
    int i, CostBef, CostAft;
    p->pPars->Area = p->pPars->Edge = p->pPars->Clause = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 1 );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            if ( Jf_CutCheckMffc(p, Jf_ObjCutBest(p, i), 50) )
            {
                CostBef = Jf_CutDeref_rec( p, Jf_ObjCutBest(p, i) );
                Jf_ObjComputeBestCut( p, pObj, fEdge, 1 );
                CostAft = Jf_CutRef_rec( p, Jf_ObjCutBest(p, i) );
    //            if ( CostBef != CostAft )  printf( "%d -> %d   ", CostBef, CostAft );
                assert( CostBef >= CostAft ); // does not hold because of JF_EDGE_LIM
            }
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, Jf_ObjCutBest(p, i));
            p->pPars->Edge += Jf_CutSize(Jf_ObjCutBest(p, i));
            p->pPars->Area++;
        }
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
//    printf( "\n" );
}